

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_GetArg::test_method(util_GetArg *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_01;
  long lVar1;
  bool bVar2;
  vector<UniValue,std::allocator<UniValue>> *pvVar3;
  mapped_type *pmVar4;
  iterator pvVar5;
  iterator pvVar6;
  key_type *pkVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  allocator<char> local_3d9;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  allocator<char> local_3a1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  string local_390;
  key_type local_370;
  UniValue local_350;
  undefined1 local_2f8 [88];
  key_type local_2a0;
  TestArgsManager testArgs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&testArgs);
  pvVar5 = (iterator)0x25f;
  pvVar6 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock18,(AnnotatedMixin<std::recursive_mutex> *)&testArgs,"testArgs.cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
             ,0x25f,false);
  this_00 = &testArgs.super_ArgsManager.m_settings.command_line_options;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear(&this_00->_M_t);
  UniValue::UniValue<const_char_(&)[10],_char[10],_true>(&local_350,(char (*) [10])"string...");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"strtest1",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>(&local_350,(char (*) [6])0xc69d87);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"inttest1",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            (&local_350,(char (*) [18])"81985529216486895");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"inttest2",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_350,(char (*) [1])0xc694e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest1",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xcbbcad);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest3",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xc69f21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest4",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xb945ba);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>((UniValue *)local_2f8,(char (*) [2])0xb5210d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"pritest1",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  lVar8 = 0x58;
  do {
    UniValue::~UniValue((UniValue *)((long)&local_350.typ + lVar8));
    lVar8 = lVar8 + -0x58;
  } while (lVar8 != -0x58);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xb945ba);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>((UniValue *)local_2f8,(char (*) [2])0xb5210d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",(allocator<char> *)&local_390);
  this_01 = &testArgs.super_ArgsManager.m_settings.ro_config;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_01,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest2",&local_3a1);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar4,&local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,&local_2a0);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_2a0);
  lVar8 = 0x58;
  do {
    UniValue::~UniValue((UniValue *)((long)&local_350.typ + lVar8));
    lVar8 = lVar8 + -0x58;
  } while (lVar8 != -0x58);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xb945ba);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"pritest3",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xb5210d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",(allocator<char> *)&local_390);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_01,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest3",&local_3a1);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar4,&local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,local_2f8);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_2a0);
  UniValue::~UniValue(&local_350);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xb945ba);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>((UniValue *)local_2f8,(char (*) [2])0xb5210d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"pritest4",(allocator<char> *)&local_370);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,&local_2a0);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  lVar8 = 0x58;
  do {
    UniValue::~UniValue((UniValue *)((long)&local_350.typ + lVar8));
    lVar8 = lVar8 + -0x58;
  } while (lVar8 != -0x58);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_350,(char (*) [2])0xc68755);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>((UniValue *)local_2f8,(char (*) [2])0xc6875d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",(allocator<char> *)&local_390);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_01,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest4",&local_3a1);
  pvVar3 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar4,&local_370);
  std::vector<UniValue,std::allocator<UniValue>>::_M_assign_aux<UniValue_const*>
            (pvVar3,&local_350,&local_2a0);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_2a0);
  lVar8 = 0x58;
  do {
    UniValue::~UniValue((UniValue *)((long)&local_350.typ + lVar8));
    lVar8 = lVar8 + -0x58;
  } while (lVar8 != -0x58);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar6;
  msg.m_begin = pvVar5;
  file.m_end = (iterator)0x273;
  file.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3c8,msg);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3d0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"strtest1",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  pvVar5 = (iterator)0x2;
  pkVar7 = &local_2a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_350,&local_3d8,0x273,1,2,pkVar7,"testArgs.GetArg(\"strtest1\", \"default\")",
             "string...","\"string...\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pkVar7;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x274;
  file_00.m_begin = (iterator)&local_3f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_400,
             msg_00);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_408 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"strtest2",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  pvVar5 = (iterator)0x2;
  pkVar7 = &local_2a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (&local_350,&local_410,0x274,1,2,pkVar7,"testArgs.GetArg(\"strtest2\", \"default\")",
             "default","\"default\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pkVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x275;
  file_01.m_begin = (iterator)&local_420;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_430,
             msg_01);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_438 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"inttest1",&local_3a1);
  local_370._M_dataplus._M_p =
       (pointer)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_2a0,-1);
  pkVar7 = &local_370;
  local_390._M_dataplus._M_p._0_4_ = 0x3039;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_350,&local_440,0x275,1,2,pkVar7,"testArgs.GetIntArg(\"inttest1\", -1)",
             &local_390,"12345");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pkVar7;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x276;
  file_02.m_begin = (iterator)&local_450;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_460,
             msg_02);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_468 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"inttest2",&local_3a1);
  local_370._M_dataplus._M_p =
       (pointer)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_2a0,-1);
  pkVar7 = &local_370;
  local_390._M_dataplus._M_p = (pointer)0x123456789abcdef;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (&local_350,&local_470,0x276,1,2,pkVar7,"testArgs.GetIntArg(\"inttest2\", -1)",
             &local_390,"81985529216486895LL");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pkVar7;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x277;
  file_03.m_begin = (iterator)&local_480;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_490,
             msg_03);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_498 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"inttest3",&local_3a1);
  local_370._M_dataplus._M_p =
       (pointer)ArgsManager::GetIntArg(&testArgs.super_ArgsManager,&local_2a0,-1);
  pkVar7 = &local_370;
  local_390._M_dataplus._M_p._0_4_ = 0xffffffff;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_350,&local_4a0,0x277,1,2,pkVar7,"testArgs.GetIntArg(\"inttest3\", -1)",
             &local_390,"-1");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pkVar7;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x278;
  file_04.m_begin = (iterator)&local_4b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4c0,
             msg_04);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4c8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest1",(allocator<char> *)&local_390);
  bVar2 = ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_2a0,false);
  pkVar7 = &local_370;
  local_3a1 = (allocator<char>)0x1;
  pvVar5 = (iterator)0x2;
  local_370._M_dataplus._M_p._0_1_ = bVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_4d0,0x278,1,2,pkVar7,"testArgs.GetBoolArg(\"booltest1\", false)",
             &local_3a1,"true");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pkVar7;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x279;
  file_05.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4f0,
             msg_05);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_4f8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest2",(allocator<char> *)&local_390);
  local_370._M_dataplus._M_p._0_1_ =
       ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_2a0,false);
  pkVar7 = &local_370;
  local_3a1 = (allocator<char>)0x0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_500,0x279,1,2,pkVar7,"testArgs.GetBoolArg(\"booltest2\", false)",
             &local_3a1,"false");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pkVar7;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x27a;
  file_06.m_begin = (iterator)&local_510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_520,
             msg_06);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_528 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest3",(allocator<char> *)&local_390);
  local_370._M_dataplus._M_p._0_1_ =
       ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_2a0,false);
  pkVar7 = &local_370;
  local_3a1 = (allocator<char>)0x0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_530,0x27a,1,2,pkVar7,"testArgs.GetBoolArg(\"booltest3\", false)",
             &local_3a1,"false");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pkVar7;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x27b;
  file_07.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_550,
             msg_07);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_558 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"booltest4",(allocator<char> *)&local_390);
  local_370._M_dataplus._M_p._0_1_ =
       ArgsManager::GetBoolArg(&testArgs.super_ArgsManager,&local_2a0,false);
  pkVar7 = &local_370;
  local_3a1 = (allocator<char>)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_560,0x27b,1,2,pkVar7,"testArgs.GetBoolArg(\"booltest4\", false)",
             &local_3a1,"true");
  std::__cxx11::string::~string((string *)&local_2a0);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pkVar7;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x27d;
  file_08.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_580,
             msg_08);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_588 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest1",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  pvVar5 = (iterator)0x2;
  pkVar7 = &local_2a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_350,&local_590,0x27d,1,2,pkVar7,"testArgs.GetArg(\"pritest1\", \"default\")","b"
             ,"\"b\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pkVar7;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x27e;
  file_09.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5b0,
             msg_09);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5b8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest2",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  pvVar5 = (iterator)0x2;
  pkVar7 = &local_2a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_350,&local_5c0,0x27e,1,2,pkVar7,"testArgs.GetArg(\"pritest2\", \"default\")","a"
             ,"\"a\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pkVar7;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x27f;
  file_10.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5e0,
             msg_10);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5e8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest3",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  pvVar5 = (iterator)0x2;
  pkVar7 = &local_2a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_350,&local_5f0,0x27f,1,2,pkVar7,"testArgs.GetArg(\"pritest3\", \"default\")","a"
             ,"\"a\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pkVar7;
  msg_11.m_begin = pvVar5;
  file_11.m_end = (iterator)0x280;
  file_11.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_610,
             msg_11);
  local_350.val._M_dataplus._M_p._0_1_ = 0;
  local_350._0_8_ = &PTR__lazy_ostream_01139f30;
  local_350.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_618 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"pritest4",&local_3a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"default",&local_3d9);
  ArgsManager::GetArg(&local_2a0,&testArgs.super_ArgsManager,&local_370,&local_390);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (&local_350,&local_620,0x280,1,2,&local_2a0,"testArgs.GetArg(\"pritest4\", \"default\")"
             ,"b","\"b\"");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock18.super_unique_lock);
  ArgsManager::~ArgsManager(&testArgs.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetArg)
{
    TestArgsManager testArgs;
    LOCK(testArgs.cs_args);
    testArgs.m_settings.command_line_options.clear();
    testArgs.m_settings.command_line_options["strtest1"] = {"string..."};
    // strtest2 undefined on purpose
    testArgs.m_settings.command_line_options["inttest1"] = {"12345"};
    testArgs.m_settings.command_line_options["inttest2"] = {"81985529216486895"};
    // inttest3 undefined on purpose
    testArgs.m_settings.command_line_options["booltest1"] = {""};
    // booltest2 undefined on purpose
    testArgs.m_settings.command_line_options["booltest3"] = {"0"};
    testArgs.m_settings.command_line_options["booltest4"] = {"1"};

    // priorities
    testArgs.m_settings.command_line_options["pritest1"] = {"a", "b"};
    testArgs.m_settings.ro_config[""]["pritest2"] = {"a", "b"};
    testArgs.m_settings.command_line_options["pritest3"] = {"a"};
    testArgs.m_settings.ro_config[""]["pritest3"] = {"b"};
    testArgs.m_settings.command_line_options["pritest4"] = {"a","b"};
    testArgs.m_settings.ro_config[""]["pritest4"] = {"c","d"};

    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest1", "default"), "string...");
    BOOST_CHECK_EQUAL(testArgs.GetArg("strtest2", "default"), "default");
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest1", -1), 12345);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest2", -1), 81985529216486895LL);
    BOOST_CHECK_EQUAL(testArgs.GetIntArg("inttest3", -1), -1);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest1", false), true);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest2", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest3", false), false);
    BOOST_CHECK_EQUAL(testArgs.GetBoolArg("booltest4", false), true);

    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest1", "default"), "b");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest2", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest3", "default"), "a");
    BOOST_CHECK_EQUAL(testArgs.GetArg("pritest4", "default"), "b");
}